

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGXMLScanner.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::SGXMLScanner::updateNSMap
          (SGXMLScanner *this,XMLCh *attrName,XMLCh *attrValue,int colonOfs)

{
  XMLBufferMgr *this_00;
  XMLCh XVar1;
  XMLCh XVar2;
  XMLCh *pXVar3;
  XMLStringPool *pXVar4;
  uint uriId;
  XMLBuffer *toFill;
  XMLCh *pXVar5;
  XMLCh *pXVar6;
  XMLCh *pXVar7;
  Codes toEmit;
  XMLCh *pXVar8;
  XMLBufBid bbNormal;
  
  this_00 = &(this->super_XMLScanner).fBufMgr;
  toFill = XMLBufferMgr::bidOnBuffer(this_00);
  normalizeAttRawValue(this,attrName,attrValue,toFill);
  pXVar3 = toFill->fBuffer;
  pXVar3[toFill->fIndex] = L'\0';
  if (colonOfs == -1) {
    pXVar8 = L"";
LAB_002b4068:
    if (pXVar3 == L"http://www.w3.org/2000/xmlns/") goto LAB_002b40f5;
    if (pXVar3 == (XMLCh *)0x0) goto LAB_002b40b6;
    pXVar5 = L"http://www.w3.org/2000/xmlns/";
    pXVar6 = pXVar3;
    do {
      XVar1 = *pXVar6;
      if (XVar1 == L'\0') goto LAB_002b40bd;
      pXVar6 = pXVar6 + 1;
      XVar2 = *pXVar5;
      pXVar5 = pXVar5 + 1;
    } while (XVar1 == XVar2);
  }
  else {
    pXVar8 = attrName + (long)colonOfs + 1;
    toEmit = NoUseOfxmlnsAsPrefix;
    if (pXVar8 != L"xmlns") {
      pXVar5 = L"xmlns";
      pXVar6 = pXVar8;
      if (pXVar8 == (XMLCh *)0x0) {
LAB_002b3fb3:
        if (*pXVar5 == L'\0') goto LAB_002b4033;
      }
      else {
        do {
          XVar1 = *pXVar6;
          if (XVar1 == L'\0') goto LAB_002b3fb3;
          XVar2 = *pXVar5;
          pXVar5 = pXVar5 + 1;
          pXVar6 = pXVar6 + 1;
        } while (XVar1 == XVar2);
      }
      if (pXVar8 != L"xml") {
        pXVar5 = L"xml";
        pXVar6 = pXVar8;
        if (pXVar8 == (XMLCh *)0x0) {
LAB_002b3feb:
          if (*pXVar5 == L'\0') goto LAB_002b3ff1;
        }
        else {
          do {
            XVar1 = *pXVar6;
            if (XVar1 == L'\0') goto LAB_002b3feb;
            XVar2 = *pXVar5;
            pXVar5 = pXVar5 + 1;
            pXVar6 = pXVar6 + 1;
          } while (XVar1 == XVar2);
        }
        goto LAB_002b403b;
      }
LAB_002b3ff1:
      if (pXVar3 != L"http://www.w3.org/XML/1998/namespace") {
        pXVar5 = L"http://www.w3.org/XML/1998/namespace";
        pXVar6 = pXVar3;
        if (pXVar3 == (XMLCh *)0x0) {
LAB_002b4028:
          toEmit = PrefixXMLNotMatchXMLURI;
          if (*pXVar5 == L'\0') goto LAB_002b403b;
        }
        else {
          do {
            XVar1 = *pXVar6;
            if (XVar1 == L'\0') goto LAB_002b4028;
            XVar2 = *pXVar5;
            pXVar5 = pXVar5 + 1;
            pXVar6 = pXVar6 + 1;
          } while (XVar1 == XVar2);
          toEmit = PrefixXMLNotMatchXMLURI;
        }
        goto LAB_002b4033;
      }
LAB_002b4040:
      if ((*pXVar3 == L'\0') && ((this->super_XMLScanner).fXMLVersion == XMLV1_0)) {
        XMLScanner::emitError
                  (&this->super_XMLScanner,NoEmptyStrNamespace,attrName,(XMLCh *)0x0,(XMLCh *)0x0,
                   (XMLCh *)0x0);
      }
      goto LAB_002b4068;
    }
LAB_002b4033:
    XMLScanner::emitError(&this->super_XMLScanner,toEmit);
LAB_002b403b:
    if (pXVar3 != (XMLCh *)0x0) goto LAB_002b4040;
    XMLScanner::emitError
              (&this->super_XMLScanner,NoEmptyStrNamespace,attrName,(XMLCh *)0x0,(XMLCh *)0x0,
               (XMLCh *)0x0);
LAB_002b40b6:
    pXVar5 = L"http://www.w3.org/2000/xmlns/";
LAB_002b40bd:
    if (*pXVar5 == L'\0') {
LAB_002b40f5:
      XMLScanner::emitError(&this->super_XMLScanner,NoUseOfxmlnsURI);
      pXVar5 = pXVar8;
      goto LAB_002b415d;
    }
  }
  pXVar5 = pXVar8;
  if (pXVar3 != L"http://www.w3.org/XML/1998/namespace") {
    pXVar6 = L"http://www.w3.org/XML/1998/namespace";
    pXVar7 = pXVar3;
    if (pXVar3 != (XMLCh *)0x0) {
      do {
        XVar1 = *pXVar7;
        if (XVar1 == L'\0') goto LAB_002b4107;
        XVar2 = *pXVar6;
        pXVar6 = pXVar6 + 1;
        pXVar7 = pXVar7 + 1;
      } while (XVar1 == XVar2);
      goto LAB_002b415d;
    }
LAB_002b4107:
    if (*pXVar6 != L'\0') goto LAB_002b415d;
  }
  pXVar5 = L"xml";
  if (pXVar8 != L"xml") {
    pXVar6 = L"xml";
    pXVar5 = pXVar8;
    if (pXVar8 == (XMLCh *)0x0) {
LAB_002b4142:
      pXVar5 = pXVar8;
      if (*pXVar6 == L'\0') goto LAB_002b415d;
    }
    else {
      do {
        XVar1 = *pXVar5;
        if (XVar1 == L'\0') goto LAB_002b4142;
        XVar2 = *pXVar6;
        pXVar6 = pXVar6 + 1;
        pXVar5 = pXVar5 + 1;
      } while (XVar1 == XVar2);
    }
    XMLScanner::emitError(&this->super_XMLScanner,XMLURINotMatchXMLPrefix);
    pXVar5 = pXVar8;
  }
LAB_002b415d:
  pXVar4 = (this->super_XMLScanner).fURIStringPool;
  uriId = (*(pXVar4->super_XSerializable)._vptr_XSerializable[5])(pXVar4,pXVar3);
  ElemStack::addPrefix(&(this->super_XMLScanner).fElemStack,pXVar5,uriId);
  XMLBufferMgr::releaseBuffer(this_00,toFill);
  return;
}

Assistant:

void SGXMLScanner::updateNSMap(const  XMLCh* const    attrName
                              , const XMLCh* const    attrValue
                              , const int colonOfs)
{
    // We need a buffer to normalize the attribute value into
    XMLBufBid bbNormal(&fBufMgr);
    XMLBuffer& normalBuf = bbNormal.getBuffer();

    //  Normalize the value into the passed buffer. In this case, we don't
    //  care about the return value. An error was issued for the error, which
    //  is all we care about here.
    normalizeAttRawValue(attrName, attrValue, normalBuf);
    XMLCh* namespaceURI = normalBuf.getRawBuffer();

    //  We either have the default prefix (""), or we point it into the attr
    //  name parameter. Note that the xmlns is not the prefix we care about
    //  here. To us, the 'prefix' is really the local part of the attrName
    //  parameter.
    //
    //  Check 1. xxx is not xmlns
    //        2. if xxx is xml, then yyy must match XMLUni::fgXMLURIName, and vice versa
    //        3. yyy is not XMLUni::fgXMLNSURIName
    //        4. if xxx is not null, then yyy cannot be an empty string.
    const XMLCh* prefPtr = XMLUni::fgZeroLenString;
    if (colonOfs != -1) {
        prefPtr = &attrName[colonOfs + 1];

        if (XMLString::equals(prefPtr, XMLUni::fgXMLNSString))
            emitError(XMLErrs::NoUseOfxmlnsAsPrefix);
        else if (XMLString::equals(prefPtr, XMLUni::fgXMLString)) {
            if (!XMLString::equals(namespaceURI, XMLUni::fgXMLURIName))
                emitError(XMLErrs::PrefixXMLNotMatchXMLURI);
        }

        if (!namespaceURI)
            emitError(XMLErrs::NoEmptyStrNamespace, attrName);
        else if(!*namespaceURI && fXMLVersion == XMLReader::XMLV1_0)
            emitError(XMLErrs::NoEmptyStrNamespace, attrName);
    }

    if (XMLString::equals(namespaceURI, XMLUni::fgXMLNSURIName))
        emitError(XMLErrs::NoUseOfxmlnsURI);
    else if (XMLString::equals(namespaceURI, XMLUni::fgXMLURIName)) {
        if (!XMLString::equals(prefPtr, XMLUni::fgXMLString))
            emitError(XMLErrs::XMLURINotMatchXMLPrefix);
    }

    //  Ok, we have to get the unique id for the attribute value, which is the
    //  URI that this value should be mapped to. The validator has the
    //  namespace string pool, so we ask him to find or add this new one. Then
    //  we ask the element stack to add this prefix to URI Id mapping.
    fElemStack.addPrefix
    (
        prefPtr
        , fURIStringPool->addOrFind(namespaceURI)
    );
}